

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_proxy_connect(connectdata *conn,int sockindex)

{
  Curl_easy *pCVar1;
  void *pvVar2;
  CURLcode CVar3;
  CURLcode CVar4;
  uint remote_port;
  long lVar5;
  _Bool *done;
  HTTP http_proxy;
  undefined1 auStack_b8 [136];
  
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    done = (conn->bits).proxy_ssl_connected + sockindex;
    CVar4 = CURLE_OK;
    if ((*done == false) &&
       (CVar3 = Curl_ssl_connect_nonblocking(conn,sockindex,done), CVar3 != CURLE_OK)) {
      (conn->bits).close = true;
      CVar4 = CVar3;
    }
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if (*done != true) {
      return CURLE_OK;
    }
  }
  if (((conn->bits).tunnel_proxy == true) && ((conn->bits).httpproxy == true)) {
    pCVar1 = conn->data;
    pvVar2 = (pCVar1->req).protop;
    memset(auStack_b8,0,0x88);
    (pCVar1->req).protop = auStack_b8;
    Curl_conncontrol(conn,0);
    lVar5 = 0x100;
    if ((conn->bits).conn_to_host == false) {
      lVar5 = (ulong)(sockindex == 1) * 0x10 + 0xd8;
    }
    if (sockindex == 1) {
      remote_port = (uint)conn->secondary_port;
    }
    else if ((conn->bits).conn_to_port == true) {
      remote_port = conn->conn_to_port;
    }
    else {
      remote_port = conn->remote_port;
    }
    CVar4 = Curl_proxyCONNECT(conn,sockindex,*(char **)((conn->chunk).hexbuffer + lVar5 + -0x20),
                              remote_port);
    (conn->data->req).protop = pvVar2;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    (*Curl_cfree)((conn->allocptr).proxyuserpwd);
    (conn->allocptr).proxyuserpwd = (char *)0x0;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_proxy_connect(struct connectdata *conn, int sockindex)
{
  if(conn->http_proxy.proxytype == CURLPROXY_HTTPS) {
    const CURLcode result = https_proxy_connect(conn, sockindex);
    if(result)
      return result;
    if(!conn->bits.proxy_ssl_connected[sockindex])
      return result; /* wait for HTTPS proxy SSL initialization to complete */
  }

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy) {
#ifndef CURL_DISABLE_PROXY
    /* for [protocol] tunneled through HTTP proxy */
    struct HTTP http_proxy;
    void *prot_save;
    const char *hostname;
    int remote_port;
    CURLcode result;

    /* BLOCKING */
    /* We want "seamless" operations through HTTP proxy tunnel */

    /* Curl_proxyCONNECT is based on a pointer to a struct HTTP at the
     * member conn->proto.http; we want [protocol] through HTTP and we have
     * to change the member temporarily for connecting to the HTTP
     * proxy. After Curl_proxyCONNECT we have to set back the member to the
     * original pointer
     *
     * This function might be called several times in the multi interface case
     * if the proxy's CONNECT response is not instant.
     */
    prot_save = conn->data->req.protop;
    memset(&http_proxy, 0, sizeof(http_proxy));
    conn->data->req.protop = &http_proxy;
    connkeep(conn, "HTTP proxy CONNECT");

    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */

    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else if(sockindex == SECONDARYSOCKET)
      hostname = conn->secondaryhostname;
    else
      hostname = conn->host.name;

    if(sockindex == SECONDARYSOCKET)
      remote_port = conn->secondary_port;
    else if(conn->bits.conn_to_port)
      remote_port = conn->conn_to_port;
    else
      remote_port = conn->remote_port;
    result = Curl_proxyCONNECT(conn, sockindex, hostname, remote_port);
    conn->data->req.protop = prot_save;
    if(CURLE_OK != result)
      return result;
    Curl_safefree(conn->allocptr.proxyuserpwd);
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  /* no HTTP tunnel proxy, just return */
  return CURLE_OK;
}